

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O2

Integer pnga_sprs_array_dnssprs_multiply(Integer g_a,Integer s_b,Integer trans)

{
  int *piVar1;
  double *pdVar2;
  long *plVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined8 uVar9;
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  long lVar17;
  Integer IVar18;
  Integer IVar19;
  C_Integer *pCVar20;
  Integer *mapc;
  void *pvVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  logical lVar26;
  Integer IVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  double *pdVar38;
  bool bVar39;
  float fVar40;
  float fVar41;
  long local_200;
  long local_1e0;
  long local_1d0;
  void *data_c;
  long local_1b8;
  long local_1b0;
  long local_1a0;
  long local_198;
  long local_190;
  long local_188;
  long local_180;
  Integer jlo_b;
  long local_168;
  long local_160;
  long local_158;
  Integer local_150;
  Integer local_148;
  long local_140;
  long local_138;
  long local_130;
  Integer local_128;
  int local_11c;
  Integer tlo_c [2];
  long local_108;
  long local_100;
  Integer hi_c [2];
  Integer lo_c [2];
  void *val_b;
  Integer ihi_b;
  Integer ilo_b;
  void *jptr_b;
  void *iptr_b;
  Integer ld_a [2];
  Integer jhi_b;
  Integer local_58;
  Integer local_50;
  long local_48;
  long local_40;
  
  lVar25 = g_a + 1000;
  lVar17 = s_b + 1000;
  IVar18 = pnga_pgroup_nnodes(SPA[lVar17].grp);
  IVar19 = pnga_pgroup_nodeid(SPA[lVar17].grp);
  bVar39 = _ga_sync_begin != 0;
  local_11c = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (bVar39) {
    pnga_pgroup_sync(SPA[lVar17].grp);
  }
  local_168 = lVar17 * 200;
  if (SPA[lVar17].type != (long)GA[lVar25].type) {
    pnga_error("(ga_sprs_array_dnssprs_multiply) types of sparse matrices A and B must match",0);
  }
  local_148 = *(Integer *)((long)&SPA->type + local_168);
  if (*(long *)((long)&SPA->grp + local_168) != (long)GA[lVar25].p_handle) {
    pnga_error("(ga_sprs_array_dnssprs_multiply) matrices A and B must be on the same group",0);
  }
  if ((long)GA[lVar25].ndim != 2) {
    pnga_error("(ga_sprs_array_dnssprs_multiply) matrix A must be of dimension 2",
               (long)GA[lVar25].ndim);
  }
  lVar17 = *(long *)((long)&SPA->jdim + local_168);
  if (trans == 0) {
    if (GA[lVar25].dims[1] != lVar17) goto LAB_00150838;
LAB_00150862:
    pCVar20 = GA[lVar25].dims;
  }
  else {
    if (GA[lVar25].dims[0] != lVar17) {
LAB_00150838:
      pnga_error("(ga_sprs_array_dnssprs_multiply) column dimension of A must match row dimension of B"
                 ,0);
      if (trans == 0) goto LAB_00150862;
    }
    pCVar20 = GA[lVar25].dims + 1;
  }
  lVar25 = *pCVar20;
  lVar17 = *(long *)((long)&SPA->jdim + local_168);
  local_150 = pnga_create_handle();
  local_40 = lVar25;
  local_48 = lVar17;
  if (trans == 0) {
    local_40 = lVar17;
    local_48 = lVar25;
  }
  pnga_set_data(local_150,2,&local_48,local_148);
  mapc = (Integer *)malloc(IVar18 * 8 + 8);
  pvVar21 = malloc(IVar18 * 8);
  lVar22 = (lVar25 * IVar19) / IVar18;
  lVar32 = IVar18 * lVar22;
  lVar30 = (lVar22 + -1) * IVar18;
  do {
    lVar23 = lVar32 / lVar25;
    lVar22 = lVar22 + 1;
    lVar32 = lVar32 + IVar18;
    lVar30 = lVar30 + IVar18;
  } while (lVar23 < IVar19);
  do {
    lVar32 = lVar30 / lVar25;
    lVar22 = lVar22 + -1;
    lVar30 = lVar30 - IVar18;
  } while (IVar19 < lVar32);
  uVar34 = (ulong)(lVar32 != IVar19);
  lVar30 = lVar25;
  if (IVar19 < IVar18 + -1) {
    lVar30 = (lVar25 * (IVar19 + 1)) / IVar18;
    lVar23 = IVar18 * lVar30;
    lVar32 = (lVar30 + -1) * IVar18;
    do {
      lVar24 = lVar23 / lVar25;
      lVar30 = lVar30 + 1;
      lVar23 = lVar23 + IVar18;
      lVar32 = lVar32 + IVar18;
    } while (lVar24 <= IVar19);
    do {
      lVar23 = lVar32 / lVar25;
      lVar30 = lVar30 + -1;
      lVar32 = lVar32 - IVar18;
    } while (IVar19 + 1 < lVar23);
  }
  lVar25 = 0;
  local_130 = 0;
  if (0 < IVar18) {
    local_130 = IVar18;
  }
  for (; local_130 != lVar25; lVar25 = lVar25 + 1) {
    *(undefined8 *)((long)pvVar21 + lVar25 * 8) = 0;
  }
  *(ulong *)((long)pvVar21 + IVar19 * 8) = (lVar30 - uVar34) - lVar22;
  pnga_pgroup_gop(*(Integer *)((long)&SPA->grp + local_168),0x3ea,pvVar21,IVar18,"+");
  IVar19 = local_150;
  *mapc = 1;
  if (trans == 0) {
    lVar25 = 1;
    for (lVar32 = lVar25; lVar32 < IVar18; lVar32 = lVar32 + 1) {
      lVar25 = lVar25 + *(long *)((long)pvVar21 + lVar32 * 8 + -8);
      mapc[lVar32] = lVar25;
    }
    mapc[IVar18] = 1;
    local_50 = 1;
    local_58 = IVar18;
  }
  else {
    mapc[1] = 1;
    for (IVar27 = 1; local_58 = 1, local_50 = IVar18, IVar27 < IVar18; IVar27 = IVar27 + 1) {
      mapc[IVar27 + 1] = *(long *)((long)pvVar21 + IVar27 * 8 + -8) + mapc[IVar27];
    }
  }
  pnga_set_irreg_distr(local_150,mapc,&local_58);
  pnga_set_pgroup(IVar19,*(Integer *)((long)&SPA->grp + local_168));
  lVar26 = pnga_allocate(IVar19);
  if (lVar26 == 0) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) could not allocate product array C",0);
  }
  pnga_zero(IVar19);
  IVar18 = 0;
  while (IVar18 != local_130) {
    local_128 = IVar18;
    hi_c[0] = lVar30;
    lo_c[0] = uVar34 + lVar22 + 1;
    pnga_sprs_array_row_distribution(s_b,IVar18,lo_c + 1,hi_c + 1);
    lo_c[1] = lo_c[1] + 1;
    hi_c[1] = hi_c[1] + 1;
    if (trans == 0) {
      tlo_c[0] = lo_c[0];
      local_108 = hi_c[0];
      local_100 = hi_c[1];
      tlo_c[1] = lo_c[1];
    }
    else {
      tlo_c[1] = lo_c[0];
      local_100 = hi_c[0];
      tlo_c[0] = lo_c[1];
      local_108 = hi_c[1];
    }
    local_138 = lo_c[0];
    local_140 = hi_c[0];
    for (lVar25 = 0; lVar25 != local_130; lVar25 = lVar25 + 1) {
      if (trans == 0) {
        local_1b8 = (local_108 - tlo_c[0]) + 1;
        local_1b0 = lVar17;
      }
      else {
        local_1b0 = (local_100 - tlo_c[1]) + 1;
        local_1b8 = lVar17;
      }
      pnga_access_ptr(local_150,tlo_c,&local_108,&data_c,&local_1b8);
      lVar26 = pnga_sprs_array_get_block
                         (s_b,lVar25,local_128,&iptr_b,&jptr_b,&val_b,&ilo_b,&ihi_b,&jlo_b,&jhi_b);
      IVar18 = ilo_b;
      lVar32 = local_168;
      if (lVar26 != 0) {
        local_1a0 = ihi_b;
        local_188 = ilo_b;
        local_180 = local_138;
        local_198 = ihi_b;
        local_190 = local_140;
        if (trans == 0) {
          local_188 = local_138;
          local_180 = ilo_b;
          local_198 = local_140;
          local_190 = ihi_b;
        }
        lVar23 = (local_198 - local_188) + 1;
        lVar24 = (local_190 - local_180) + 1;
        pvVar21 = malloc(lVar24 * lVar23 * *(long *)((long)&SPA->size + local_168));
        ld_a[0] = lVar23;
        ld_a[1] = lVar24;
        pnga_get(g_a,&local_188,&local_198,pvVar21,ld_a);
        if (*(long *)((long)&SPA->idx_size + lVar32) == 4) {
          switch(local_148) {
          case 0x3e9:
            local_200 = local_198;
            lVar32 = local_188;
            if (trans != 0) {
              local_200 = local_190;
              lVar32 = local_180;
            }
            lVar24 = (local_198 - local_188) + 1;
            for (lVar23 = lVar32; lVar23 <= local_200; lVar23 = lVar23 + 1) {
              lVar31 = lVar23 - lVar32;
              for (IVar19 = IVar18; IVar19 <= local_1a0; IVar19 = IVar19 + 1) {
                lVar33 = IVar19 - IVar18;
                lVar29 = (long)(*(int *)((long)iptr_b + lVar33 * 4 + 4) -
                               *(int *)((long)iptr_b + lVar33 * 4));
                if (trans == 0) {
                  if (lVar29 < 1) {
                    lVar29 = 0;
                  }
                  for (lVar37 = 0; lVar29 != lVar37; lVar37 = lVar37 + 1) {
                    lVar35 = *(int *)((long)iptr_b + lVar33 * 4) + lVar37;
                    piVar1 = (int *)((long)data_c +
                                    ((*(int *)((long)jptr_b + lVar35 * 4) - jlo_b) + 1) * local_1b8
                                    * 4 + lVar31 * 4);
                    *piVar1 = *piVar1 + *(int *)((long)val_b + lVar35 * 4) *
                                        *(int *)((long)pvVar21 + lVar33 * lVar24 * 4 + lVar31 * 4);
                  }
                }
                else {
                  if (lVar29 < 1) {
                    lVar29 = 0;
                  }
                  for (lVar37 = 0; lVar29 != lVar37; lVar37 = lVar37 + 1) {
                    lVar35 = *(int *)((long)iptr_b + lVar33 * 4) + lVar37;
                    piVar1 = (int *)((long)data_c +
                                    (*(int *)((long)jptr_b + lVar35 * 4) - jlo_b) * 4 +
                                    local_1b8 * lVar31 * 4 + 4);
                    *piVar1 = *piVar1 + *(int *)((long)val_b + lVar35 * 4) *
                                        *(int *)((long)pvVar21 + lVar33 * 4 + lVar31 * lVar24 * 4);
                  }
                }
              }
            }
            break;
          case 0x3ea:
            local_200 = local_198;
            lVar32 = local_188;
            if (trans != 0) {
              local_200 = local_190;
              lVar32 = local_180;
            }
            lVar24 = (local_198 - local_188) + 1;
            for (lVar23 = lVar32; lVar23 <= local_200; lVar23 = lVar23 + 1) {
              lVar31 = lVar23 - lVar32;
              for (IVar19 = IVar18; IVar19 <= local_1a0; IVar19 = IVar19 + 1) {
                lVar37 = IVar19 - IVar18;
                iVar10 = *(int *)((long)iptr_b + lVar37 * 4);
                lVar33 = (long)iVar10;
                lVar29 = (long)(*(int *)((long)iptr_b + lVar37 * 4 + 4) - iVar10);
                if (trans == 0) {
                  if (lVar29 < 1) {
                    lVar29 = 0;
                  }
                  for (lVar35 = 0; lVar29 != lVar35; lVar35 = lVar35 + 1) {
                    plVar3 = (long *)((long)data_c +
                                     ((*(int *)((long)jptr_b + lVar35 * 4 + lVar33 * 4) - jlo_b) + 1
                                     ) * local_1b8 * 8 + lVar31 * 8);
                    *plVar3 = *plVar3 + *(long *)((long)val_b + lVar35 * 8 + lVar33 * 8) *
                                        *(long *)((long)pvVar21 + lVar37 * lVar24 * 8 + lVar31 * 8);
                  }
                }
                else {
                  if (lVar29 < 1) {
                    lVar29 = 0;
                  }
                  for (lVar35 = 0; lVar29 != lVar35; lVar35 = lVar35 + 1) {
                    plVar3 = (long *)((long)data_c +
                                     local_1b8 * lVar31 * 8 +
                                     (*(int *)((long)jptr_b + lVar35 * 4 + lVar33 * 4) - jlo_b) * 8
                                     + 8);
                    *plVar3 = *plVar3 + *(long *)((long)val_b + lVar35 * 8 + lVar33 * 8) *
                                        *(long *)((long)pvVar21 + lVar37 * 8 + lVar31 * lVar24 * 8);
                  }
                }
              }
            }
            break;
          case 0x3eb:
            local_200 = local_198;
            lVar32 = local_188;
            if (trans != 0) {
              local_200 = local_190;
              lVar32 = local_180;
            }
            lVar24 = (local_198 - local_188) + 1;
            for (lVar23 = lVar32; lVar23 <= local_200; lVar23 = lVar23 + 1) {
              lVar31 = lVar23 - lVar32;
              for (IVar19 = IVar18; IVar19 <= local_1a0; IVar19 = IVar19 + 1) {
                lVar37 = IVar19 - IVar18;
                iVar10 = *(int *)((long)iptr_b + lVar37 * 4);
                lVar33 = (long)iVar10;
                lVar29 = (long)(*(int *)((long)iptr_b + lVar37 * 4 + 4) - iVar10);
                if (trans == 0) {
                  if (lVar29 < 1) {
                    lVar29 = 0;
                  }
                  for (lVar35 = 0; lVar29 != lVar35; lVar35 = lVar35 + 1) {
                    lVar36 = ((*(int *)((long)jptr_b + lVar35 * 4 + lVar33 * 4) - jlo_b) + 1) *
                             local_1b8;
                    *(float *)((long)data_c + lVar36 * 4 + lVar31 * 4) =
                         *(float *)((long)pvVar21 + lVar37 * lVar24 * 4 + lVar31 * 4) *
                         *(float *)((long)val_b + lVar35 * 4 + lVar33 * 4) +
                         *(float *)((long)data_c + lVar36 * 4 + lVar31 * 4);
                  }
                }
                else {
                  if (lVar29 < 1) {
                    lVar29 = 0;
                  }
                  lVar35 = local_1b8 * lVar31 * 4 + 4;
                  for (lVar36 = 0; lVar29 != lVar36; lVar36 = lVar36 + 1) {
                    lVar28 = *(int *)((long)jptr_b + lVar36 * 4 + lVar33 * 4) - jlo_b;
                    *(float *)((long)data_c + lVar28 * 4 + lVar35) =
                         *(float *)((long)pvVar21 + lVar37 * 4 + lVar31 * lVar24 * 4) *
                         *(float *)((long)val_b + lVar36 * 4 + lVar33 * 4) +
                         *(float *)((long)data_c + lVar28 * 4 + lVar35);
                  }
                }
              }
            }
            break;
          case 0x3ec:
            local_200 = local_198;
            lVar32 = local_188;
            if (trans != 0) {
              local_200 = local_190;
              lVar32 = local_180;
            }
            lVar24 = (local_198 - local_188) + 1;
            for (lVar23 = lVar32; lVar23 <= local_200; lVar23 = lVar23 + 1) {
              lVar31 = lVar23 - lVar32;
              for (IVar19 = IVar18; IVar19 <= local_1a0; IVar19 = IVar19 + 1) {
                lVar37 = IVar19 - IVar18;
                iVar10 = *(int *)((long)iptr_b + lVar37 * 4);
                lVar33 = (long)iVar10;
                lVar29 = (long)(*(int *)((long)iptr_b + lVar37 * 4 + 4) - iVar10);
                if (trans == 0) {
                  if (lVar29 < 1) {
                    lVar29 = 0;
                  }
                  for (lVar35 = 0; lVar29 != lVar35; lVar35 = lVar35 + 1) {
                    lVar36 = ((*(int *)((long)jptr_b + lVar35 * 4 + lVar33 * 4) - jlo_b) + 1) *
                             local_1b8;
                    *(double *)((long)data_c + lVar36 * 8 + lVar31 * 8) =
                         *(double *)((long)pvVar21 + lVar37 * lVar24 * 8 + lVar31 * 8) *
                         *(double *)((long)val_b + lVar35 * 8 + lVar33 * 8) +
                         *(double *)((long)data_c + lVar36 * 8 + lVar31 * 8);
                  }
                }
                else {
                  if (lVar29 < 1) {
                    lVar29 = 0;
                  }
                  lVar35 = local_1b8 * lVar31 * 8 + 8;
                  for (lVar36 = 0; lVar29 != lVar36; lVar36 = lVar36 + 1) {
                    lVar28 = *(int *)((long)jptr_b + lVar36 * 4 + lVar33 * 4) - jlo_b;
                    *(double *)((long)data_c + lVar28 * 8 + lVar35) =
                         *(double *)((long)pvVar21 + lVar37 * 8 + lVar31 * lVar24 * 8) *
                         *(double *)((long)val_b + lVar36 * 8 + lVar33 * 8) +
                         *(double *)((long)data_c + lVar28 * 8 + lVar35);
                  }
                }
              }
            }
            break;
          case 0x3ee:
            local_1e0 = local_198;
            local_158 = local_188;
            if (trans != 0) {
              local_1e0 = local_190;
              local_158 = local_180;
            }
            local_160 = (local_198 - local_188) * 2 + 2;
            lVar23 = (local_198 - local_188) + 1;
            for (lVar32 = local_158; lVar32 <= local_1e0; lVar32 = lVar32 + 1) {
              lVar24 = lVar32 - local_158;
              for (IVar19 = IVar18; IVar19 <= local_1a0; IVar19 = IVar19 + 1) {
                lVar31 = IVar19 - IVar18;
                iVar10 = *(int *)((long)iptr_b + lVar31 * 4);
                lVar33 = (long)iVar10;
                lVar29 = (long)(*(int *)((long)iptr_b + lVar31 * 4 + 4) - iVar10);
                if (trans == 0) {
                  if (lVar29 < 1) {
                    lVar29 = 0;
                  }
                  for (lVar37 = 0; lVar29 != lVar37; lVar37 = lVar37 + 1) {
                    fVar4 = *(float *)((long)pvVar21 + (local_160 * lVar24 * lVar31 | 1U) * 4);
                    lVar35 = ((*(int *)((long)jptr_b + lVar37 * 4 + lVar33 * 4) - jlo_b) + 1) *
                             local_1b8 + lVar24;
                    fVar5 = *(float *)((long)val_b + lVar37 * 8 + lVar33 * 8);
                    fVar40 = *(float *)((long)val_b + lVar37 * 8 + lVar33 * 8 + 4);
                    fVar41 = *(float *)((long)pvVar21 + (lVar31 * lVar23 + lVar24) * 8);
                    uVar9 = *(undefined8 *)((long)data_c + lVar35 * 8);
                    *(ulong *)((long)data_c + lVar35 * 8) =
                         CONCAT44((float)((ulong)uVar9 >> 0x20) + fVar5 * fVar4 + fVar41 * fVar40,
                                  (float)uVar9 + fVar5 * fVar41 + -fVar4 * fVar40);
                  }
                }
                else {
                  if (lVar29 < 1) {
                    lVar29 = 0;
                  }
                  for (lVar37 = 0; lVar29 != lVar37; lVar37 = lVar37 + 1) {
                    lVar35 = (*(int *)((long)jptr_b + lVar37 * 4 + lVar33 * 4) - jlo_b) +
                             local_1b8 * lVar24;
                    uVar9 = *(undefined8 *)((long)pvVar21 + (lVar31 + lVar24 * lVar23) * 8);
                    fVar40 = (float)uVar9;
                    fVar41 = (float)((ulong)uVar9 >> 0x20);
                    fVar4 = *(float *)((long)val_b + lVar37 * 8 + lVar33 * 8);
                    fVar5 = *(float *)((long)val_b + lVar37 * 8 + lVar33 * 8 + 4);
                    uVar9 = *(undefined8 *)((long)data_c + lVar35 * 8 + 8);
                    *(ulong *)((long)data_c + lVar35 * 8 + 8) =
                         CONCAT44((float)((ulong)uVar9 >> 0x20) + fVar4 * fVar41 + fVar40 * fVar5,
                                  (float)uVar9 + fVar4 * fVar40 + -fVar41 * fVar5);
                  }
                }
              }
            }
            break;
          case 0x3ef:
            local_1e0 = local_198;
            local_158 = local_188;
            if (trans != 0) {
              local_1e0 = local_190;
              local_158 = local_180;
            }
            local_160 = (local_198 - local_188) * 2 + 2;
            lVar23 = (local_198 - local_188) + 1;
            for (lVar32 = local_158; lVar32 <= local_1e0; lVar32 = lVar32 + 1) {
              lVar24 = lVar32 - local_158;
              for (IVar19 = IVar18; IVar19 <= local_1a0; IVar19 = IVar19 + 1) {
                lVar33 = IVar19 - IVar18;
                iVar10 = *(int *)((long)iptr_b + lVar33 * 4);
                lVar29 = (long)iVar10;
                lVar31 = (long)(*(int *)((long)iptr_b + lVar33 * 4 + 4) - iVar10);
                if (trans == 0) {
                  if (lVar31 < 1) {
                    lVar31 = 0;
                  }
                  for (lVar37 = 0; lVar31 * 4 != lVar37; lVar37 = lVar37 + 4) {
                    dVar6 = *(double *)((long)pvVar21 + (local_160 * lVar24 * lVar33 | 1U) * 8);
                    lVar35 = (((*(int *)((long)jptr_b + lVar37 + lVar29 * 4) - jlo_b) + 1) *
                              local_1b8 + lVar24) * 0x10;
                    dVar7 = *(double *)((long)val_b + lVar37 * 4 + lVar29 * 0x10);
                    dVar15 = *(double *)((long)val_b + lVar37 * 4 + lVar29 * 0x10 + 8);
                    dVar8 = *(double *)((long)pvVar21 + (lVar33 * lVar23 + lVar24) * 0x10);
                    pdVar38 = (double *)((long)data_c + lVar35);
                    dVar16 = pdVar38[1] + dVar7 * dVar6 + dVar8 * dVar15;
                    auVar12._8_4_ = SUB84(dVar16,0);
                    auVar12._0_8_ = *pdVar38 + dVar7 * dVar8 + -dVar6 * dVar15;
                    auVar12._12_4_ = (int)((ulong)dVar16 >> 0x20);
                    *(undefined1 (*) [16])((long)data_c + lVar35) = auVar12;
                  }
                }
                else {
                  if (lVar31 < 1) {
                    lVar31 = 0;
                  }
                  for (lVar37 = 0; lVar31 * 4 != lVar37; lVar37 = lVar37 + 4) {
                    lVar35 = ((*(int *)((long)jptr_b + lVar37 + lVar29 * 4) - jlo_b) +
                             local_1b8 * lVar24) * 0x10;
                    pdVar38 = (double *)((long)pvVar21 + (lVar33 + lVar24 * lVar23) * 0x10);
                    dVar8 = *pdVar38;
                    dVar16 = pdVar38[1];
                    dVar6 = *(double *)((long)val_b + lVar37 * 4 + lVar29 * 0x10);
                    dVar7 = *(double *)((long)val_b + lVar37 * 4 + lVar29 * 0x10 + 8);
                    pdVar38 = (double *)(lVar35 + 0x10 + (long)data_c);
                    dVar15 = pdVar38[1] + dVar6 * dVar16 + dVar8 * dVar7;
                    auVar11._8_4_ = SUB84(dVar15,0);
                    auVar11._0_8_ = *pdVar38 + dVar6 * dVar8 + -dVar16 * dVar7;
                    auVar11._12_4_ = (int)((ulong)dVar15 >> 0x20);
                    *(undefined1 (*) [16])(lVar35 + 0x10 + (long)data_c) = auVar11;
                  }
                }
              }
            }
            break;
          case 0x3f8:
            local_200 = local_198;
            lVar32 = local_188;
            if (trans != 0) {
              local_200 = local_190;
              lVar32 = local_180;
            }
            lVar24 = (local_198 - local_188) + 1;
            for (lVar23 = lVar32; lVar23 <= local_200; lVar23 = lVar23 + 1) {
              lVar31 = lVar23 - lVar32;
              for (IVar19 = IVar18; IVar19 <= local_1a0; IVar19 = IVar19 + 1) {
                lVar37 = IVar19 - IVar18;
                iVar10 = *(int *)((long)iptr_b + lVar37 * 4);
                lVar29 = (long)iVar10;
                lVar33 = (long)(*(int *)((long)iptr_b + lVar37 * 4 + 4) - iVar10);
                if (trans == 0) {
                  if (lVar33 < 1) {
                    lVar33 = 0;
                  }
                  for (lVar35 = 0; lVar33 != lVar35; lVar35 = lVar35 + 1) {
                    plVar3 = (long *)((long)data_c +
                                     ((*(int *)((long)jptr_b + lVar35 * 4 + lVar29 * 4) - jlo_b) + 1
                                     ) * local_1b8 * 8 + lVar31 * 8);
                    *plVar3 = *plVar3 + *(long *)((long)val_b + lVar35 * 8 + lVar29 * 8) *
                                        *(long *)((long)pvVar21 + lVar37 * lVar24 * 8 + lVar31 * 8);
                  }
                }
                else {
                  if (lVar33 < 1) {
                    lVar33 = 0;
                  }
                  for (lVar35 = 0; lVar33 != lVar35; lVar35 = lVar35 + 1) {
                    plVar3 = (long *)((long)data_c +
                                     (*(int *)((long)jptr_b + lVar35 * 4 + lVar29 * 4) - jlo_b) * 8
                                     + local_1b8 * lVar31 * 8 + 8);
                    *plVar3 = *plVar3 + *(long *)((long)val_b + lVar35 * 8 + lVar29 * 8) *
                                        *(long *)((long)pvVar21 + lVar37 * 8 + lVar31 * lVar24 * 8);
                  }
                }
              }
            }
          }
        }
        else {
          switch(local_148) {
          case 0x3e9:
            local_200 = local_198;
            lVar32 = local_188;
            if (trans != 0) {
              local_200 = local_190;
              lVar32 = local_180;
            }
            lVar24 = (local_198 - local_188) + 1;
            for (lVar23 = lVar32; lVar23 <= local_200; lVar23 = lVar23 + 1) {
              lVar31 = lVar23 - lVar32;
              for (IVar19 = IVar18; IVar19 <= local_1a0; IVar19 = IVar19 + 1) {
                lVar37 = IVar19 - IVar18;
                lVar29 = *(long *)((long)iptr_b + lVar37 * 8);
                lVar33 = *(long *)((long)iptr_b + lVar37 * 8 + 8) - lVar29;
                if (trans == 0) {
                  if (lVar33 < 1) {
                    lVar33 = 0;
                  }
                  for (lVar35 = 0; lVar33 != lVar35; lVar35 = lVar35 + 1) {
                    piVar1 = (int *)((long)data_c +
                                    ((*(long *)((long)jptr_b + lVar35 * 8 + lVar29 * 8) - jlo_b) + 1
                                    ) * local_1b8 * 4 + lVar31 * 4);
                    *piVar1 = *piVar1 + *(int *)((long)val_b + lVar35 * 4 + lVar29 * 4) *
                                        *(int *)((long)pvVar21 + lVar37 * lVar24 * 4 + lVar31 * 4);
                  }
                }
                else {
                  if (lVar33 < 1) {
                    lVar33 = 0;
                  }
                  for (lVar35 = 0; lVar33 != lVar35; lVar35 = lVar35 + 1) {
                    piVar1 = (int *)((long)data_c +
                                    (*(long *)((long)jptr_b + lVar35 * 8 + lVar29 * 8) - jlo_b) * 4
                                    + local_1b8 * lVar31 * 4 + 4);
                    *piVar1 = *piVar1 + *(int *)((long)val_b + lVar35 * 4 + lVar29 * 4) *
                                        *(int *)((long)pvVar21 + lVar37 * 4 + lVar31 * lVar24 * 4);
                  }
                }
              }
            }
            break;
          case 0x3ea:
            local_1d0 = local_198;
            lVar32 = local_188;
            if (trans != 0) {
              local_1d0 = local_190;
              lVar32 = local_180;
            }
            lVar24 = (local_198 - local_188) + 1;
            for (lVar23 = lVar32; lVar23 <= local_1d0; lVar23 = lVar23 + 1) {
              lVar31 = lVar23 - lVar32;
              for (IVar19 = IVar18; IVar19 <= local_1a0; IVar19 = IVar19 + 1) {
                lVar33 = IVar19 - IVar18;
                lVar29 = *(long *)((long)iptr_b + lVar33 * 8 + 8) -
                         *(long *)((long)iptr_b + lVar33 * 8);
                if (trans == 0) {
                  if (lVar29 < 1) {
                    lVar29 = 0;
                  }
                  for (lVar37 = 0; lVar29 != lVar37; lVar37 = lVar37 + 1) {
                    lVar35 = *(long *)((long)iptr_b + lVar33 * 8) + lVar37;
                    plVar3 = (long *)((long)data_c +
                                     ((*(long *)((long)jptr_b + lVar35 * 8) - jlo_b) + 1) *
                                     local_1b8 * 8 + lVar31 * 8);
                    *plVar3 = *plVar3 + *(long *)((long)val_b + lVar35 * 8) *
                                        *(long *)((long)pvVar21 + lVar33 * lVar24 * 8 + lVar31 * 8);
                  }
                }
                else {
                  if (lVar29 < 1) {
                    lVar29 = 0;
                  }
                  for (lVar37 = 0; lVar29 != lVar37; lVar37 = lVar37 + 1) {
                    lVar35 = *(long *)((long)iptr_b + lVar33 * 8) + lVar37;
                    plVar3 = (long *)((long)data_c +
                                     local_1b8 * lVar31 * 8 +
                                     (*(long *)((long)jptr_b + lVar35 * 8) - jlo_b) * 8 + 8);
                    *plVar3 = *plVar3 + *(long *)((long)val_b + lVar35 * 8) *
                                        *(long *)((long)pvVar21 + lVar33 * 8 + lVar31 * lVar24 * 8);
                  }
                }
              }
            }
            break;
          case 0x3eb:
            local_200 = local_198;
            lVar32 = local_188;
            if (trans != 0) {
              local_200 = local_190;
              lVar32 = local_180;
            }
            lVar24 = (local_198 - local_188) + 1;
            for (lVar23 = lVar32; lVar23 <= local_200; lVar23 = lVar23 + 1) {
              lVar31 = lVar23 - lVar32;
              for (IVar19 = IVar18; IVar19 <= local_1a0; IVar19 = IVar19 + 1) {
                lVar37 = IVar19 - IVar18;
                lVar29 = *(long *)((long)iptr_b + lVar37 * 8);
                lVar33 = *(long *)((long)iptr_b + lVar37 * 8 + 8) - lVar29;
                if (trans == 0) {
                  if (lVar33 < 1) {
                    lVar33 = 0;
                  }
                  for (lVar35 = 0; lVar33 != lVar35; lVar35 = lVar35 + 1) {
                    lVar36 = ((*(long *)((long)jptr_b + lVar35 * 8 + lVar29 * 8) - jlo_b) + 1) *
                             local_1b8;
                    *(float *)((long)data_c + lVar36 * 4 + lVar31 * 4) =
                         *(float *)((long)pvVar21 + lVar37 * lVar24 * 4 + lVar31 * 4) *
                         *(float *)((long)val_b + lVar35 * 4 + lVar29 * 4) +
                         *(float *)((long)data_c + lVar36 * 4 + lVar31 * 4);
                  }
                }
                else {
                  if (lVar33 < 1) {
                    lVar33 = 0;
                  }
                  lVar35 = local_1b8 * lVar31 * 4 + 4;
                  for (lVar36 = 0; lVar33 != lVar36; lVar36 = lVar36 + 1) {
                    lVar28 = *(long *)((long)jptr_b + lVar36 * 8 + lVar29 * 8) - jlo_b;
                    *(float *)((long)data_c + lVar28 * 4 + lVar35) =
                         *(float *)((long)pvVar21 + lVar37 * 4 + lVar31 * lVar24 * 4) *
                         *(float *)((long)val_b + lVar36 * 4 + lVar29 * 4) +
                         *(float *)((long)data_c + lVar28 * 4 + lVar35);
                  }
                }
              }
            }
            break;
          case 0x3ec:
            local_200 = local_198;
            lVar32 = local_188;
            if (trans != 0) {
              local_200 = local_190;
              lVar32 = local_180;
            }
            lVar24 = (local_198 - local_188) + 1;
            for (lVar23 = lVar32; lVar23 <= local_200; lVar23 = lVar23 + 1) {
              lVar31 = lVar23 - lVar32;
              for (IVar19 = IVar18; IVar19 <= local_1a0; IVar19 = IVar19 + 1) {
                lVar37 = IVar19 - IVar18;
                lVar29 = *(long *)((long)iptr_b + lVar37 * 8);
                lVar33 = *(long *)((long)iptr_b + lVar37 * 8 + 8) - lVar29;
                if (trans == 0) {
                  if (lVar33 < 1) {
                    lVar33 = 0;
                  }
                  for (lVar35 = 0; lVar33 != lVar35; lVar35 = lVar35 + 1) {
                    lVar36 = ((*(long *)((long)jptr_b + lVar35 * 8 + lVar29 * 8) - jlo_b) + 1) *
                             local_1b8;
                    *(double *)((long)data_c + lVar36 * 8 + lVar31 * 8) =
                         *(double *)((long)pvVar21 + lVar37 * lVar24 * 8 + lVar31 * 8) *
                         *(double *)((long)val_b + lVar35 * 8 + lVar29 * 8) +
                         *(double *)((long)data_c + lVar36 * 8 + lVar31 * 8);
                  }
                }
                else {
                  if (lVar33 < 1) {
                    lVar33 = 0;
                  }
                  lVar35 = local_1b8 * lVar31 * 8 + 8;
                  for (lVar36 = 0; lVar33 != lVar36; lVar36 = lVar36 + 1) {
                    lVar28 = *(long *)((long)jptr_b + lVar36 * 8 + lVar29 * 8) - jlo_b;
                    *(double *)((long)data_c + lVar28 * 8 + lVar35) =
                         *(double *)((long)pvVar21 + lVar37 * 8 + lVar31 * lVar24 * 8) *
                         *(double *)((long)val_b + lVar36 * 8 + lVar29 * 8) +
                         *(double *)((long)data_c + lVar28 * 8 + lVar35);
                  }
                }
              }
            }
            break;
          case 0x3ee:
            local_1e0 = local_198;
            local_158 = local_188;
            if (trans != 0) {
              local_1e0 = local_190;
              local_158 = local_180;
            }
            local_160 = (local_198 - local_188) * 2 + 2;
            lVar23 = (local_198 - local_188) + 1;
            for (lVar32 = local_158; lVar32 <= local_1e0; lVar32 = lVar32 + 1) {
              lVar24 = lVar32 - local_158;
              for (IVar19 = IVar18; IVar19 <= local_1a0; IVar19 = IVar19 + 1) {
                lVar33 = IVar19 - IVar18;
                lVar31 = *(long *)((long)iptr_b + lVar33 * 8);
                lVar29 = *(long *)((long)iptr_b + lVar33 * 8 + 8) - lVar31;
                if (trans == 0) {
                  if (lVar29 < 1) {
                    lVar29 = 0;
                  }
                  for (lVar37 = 0; lVar29 != lVar37; lVar37 = lVar37 + 1) {
                    fVar4 = *(float *)((long)pvVar21 + (local_160 * lVar24 * lVar33 | 1U) * 4);
                    lVar35 = ((*(long *)((long)jptr_b + lVar37 * 8 + lVar31 * 8) - jlo_b) + 1) *
                             local_1b8 + lVar24;
                    fVar5 = *(float *)((long)val_b + lVar37 * 8 + lVar31 * 8);
                    fVar40 = *(float *)((long)val_b + lVar37 * 8 + lVar31 * 8 + 4);
                    fVar41 = *(float *)((long)pvVar21 + (lVar33 * lVar23 + lVar24) * 8);
                    uVar9 = *(undefined8 *)((long)data_c + lVar35 * 8);
                    *(ulong *)((long)data_c + lVar35 * 8) =
                         CONCAT44((float)((ulong)uVar9 >> 0x20) + fVar5 * fVar4 + fVar41 * fVar40,
                                  (float)uVar9 + fVar5 * fVar41 + -fVar4 * fVar40);
                  }
                }
                else {
                  if (lVar29 < 1) {
                    lVar29 = 0;
                  }
                  for (lVar37 = 0; lVar29 != lVar37; lVar37 = lVar37 + 1) {
                    lVar35 = (*(long *)((long)jptr_b + lVar37 * 8 + lVar31 * 8) - jlo_b) +
                             local_1b8 * lVar24;
                    uVar9 = *(undefined8 *)((long)pvVar21 + (lVar33 + lVar24 * lVar23) * 8);
                    fVar40 = (float)uVar9;
                    fVar41 = (float)((ulong)uVar9 >> 0x20);
                    fVar4 = *(float *)((long)val_b + lVar37 * 8 + lVar31 * 8);
                    fVar5 = *(float *)((long)val_b + lVar37 * 8 + lVar31 * 8 + 4);
                    uVar9 = *(undefined8 *)((long)data_c + lVar35 * 8 + 8);
                    *(ulong *)((long)data_c + lVar35 * 8 + 8) =
                         CONCAT44((float)((ulong)uVar9 >> 0x20) + fVar4 * fVar41 + fVar40 * fVar5,
                                  (float)uVar9 + fVar4 * fVar40 + -fVar41 * fVar5);
                  }
                }
              }
            }
            break;
          case 0x3ef:
            local_1e0 = local_198;
            local_158 = local_188;
            if (trans != 0) {
              local_1e0 = local_190;
              local_158 = local_180;
            }
            local_160 = (local_198 - local_188) * 2 + 2;
            lVar23 = (local_198 - local_188) + 1;
            for (lVar32 = local_158; lVar32 <= local_1e0; lVar32 = lVar32 + 1) {
              lVar24 = lVar32 - local_158;
              for (IVar19 = IVar18; IVar19 <= local_1a0; IVar19 = IVar19 + 1) {
                lVar33 = IVar19 - IVar18;
                lVar31 = *(long *)((long)iptr_b + lVar33 * 8);
                lVar29 = *(long *)((long)iptr_b + lVar33 * 8 + 8) - lVar31;
                if (trans == 0) {
                  if (lVar29 < 1) {
                    lVar29 = 0;
                  }
                  pdVar38 = (double *)((long)val_b + lVar31 * 0x10 + 8);
                  for (lVar37 = 0; lVar29 != lVar37; lVar37 = lVar37 + 1) {
                    dVar6 = *(double *)((long)pvVar21 + (local_160 * lVar24 * lVar33 | 1U) * 8);
                    lVar35 = (((*(long *)((long)jptr_b + lVar37 * 8 + lVar31 * 8) - jlo_b) + 1) *
                              local_1b8 + lVar24) * 0x10;
                    dVar7 = *(double *)((long)pvVar21 + (lVar33 * lVar23 + lVar24) * 0x10);
                    pdVar2 = (double *)((long)data_c + lVar35);
                    dVar15 = pdVar2[1] + pdVar38[-1] * dVar6 + dVar7 * *pdVar38;
                    auVar14._8_4_ = SUB84(dVar15,0);
                    auVar14._0_8_ = *pdVar2 + pdVar38[-1] * dVar7 + -dVar6 * *pdVar38;
                    auVar14._12_4_ = (int)((ulong)dVar15 >> 0x20);
                    *(undefined1 (*) [16])((long)data_c + lVar35) = auVar14;
                    pdVar38 = pdVar38 + 2;
                  }
                }
                else {
                  if (lVar29 < 1) {
                    lVar29 = 0;
                  }
                  pdVar38 = (double *)((long)val_b + lVar31 * 0x10 + 8);
                  for (lVar37 = 0; lVar29 != lVar37; lVar37 = lVar37 + 1) {
                    lVar35 = ((*(long *)((long)jptr_b + lVar37 * 8 + lVar31 * 8) - jlo_b) +
                             local_1b8 * lVar24) * 0x10;
                    pdVar2 = (double *)((long)pvVar21 + (lVar33 + lVar24 * lVar23) * 0x10);
                    dVar7 = *pdVar2;
                    dVar15 = pdVar2[1];
                    pdVar2 = (double *)(lVar35 + 0x10 + (long)data_c);
                    dVar6 = pdVar2[1] + pdVar38[-1] * dVar15 + dVar7 * *pdVar38;
                    auVar13._8_4_ = SUB84(dVar6,0);
                    auVar13._0_8_ = *pdVar2 + pdVar38[-1] * dVar7 + -dVar15 * *pdVar38;
                    auVar13._12_4_ = (int)((ulong)dVar6 >> 0x20);
                    *(undefined1 (*) [16])(lVar35 + 0x10 + (long)data_c) = auVar13;
                    pdVar38 = pdVar38 + 2;
                  }
                }
              }
            }
            break;
          case 0x3f8:
            local_200 = local_198;
            lVar32 = local_188;
            if (trans != 0) {
              local_200 = local_190;
              lVar32 = local_180;
            }
            lVar24 = (local_198 - local_188) + 1;
            for (lVar23 = lVar32; lVar23 <= local_200; lVar23 = lVar23 + 1) {
              lVar31 = lVar23 - lVar32;
              for (IVar19 = IVar18; IVar19 <= local_1a0; IVar19 = IVar19 + 1) {
                lVar37 = IVar19 - IVar18;
                lVar29 = *(long *)((long)iptr_b + lVar37 * 8);
                lVar33 = *(long *)((long)iptr_b + lVar37 * 8 + 8) - lVar29;
                if (trans == 0) {
                  if (lVar33 < 1) {
                    lVar33 = 0;
                  }
                  for (lVar35 = 0; lVar33 != lVar35; lVar35 = lVar35 + 1) {
                    plVar3 = (long *)((long)data_c +
                                     ((*(long *)((long)jptr_b + lVar35 * 8 + lVar29 * 8) - jlo_b) +
                                     1) * local_1b8 * 8 + lVar31 * 8);
                    *plVar3 = *plVar3 + *(long *)((long)val_b + lVar35 * 8 + lVar29 * 8) *
                                        *(long *)((long)pvVar21 + lVar37 * lVar24 * 8 + lVar31 * 8);
                  }
                }
                else {
                  if (lVar33 < 1) {
                    lVar33 = 0;
                  }
                  for (lVar35 = 0; lVar33 != lVar35; lVar35 = lVar35 + 1) {
                    plVar3 = (long *)((long)data_c +
                                     (*(long *)((long)jptr_b + lVar35 * 8 + lVar29 * 8) - jlo_b) * 8
                                     + local_1b8 * lVar31 * 8 + 8);
                    *plVar3 = *plVar3 + *(long *)((long)val_b + lVar35 * 8 + lVar29 * 8) *
                                        *(long *)((long)pvVar21 + lVar37 * 8 + lVar31 * lVar24 * 8);
                  }
                }
              }
            }
          }
        }
        free(pvVar21);
      }
    }
    IVar19 = local_150;
    IVar18 = local_128 + 1;
  }
  if (local_11c != 0) {
    pnga_pgroup_sync(*(Integer *)((long)&SPA->grp + local_168));
    IVar19 = local_150;
  }
  return IVar19;
}

Assistant:

Integer pnga_sprs_array_dnssprs_multiply(Integer g_a, Integer s_b, Integer trans)
{
  Integer lcnt;
  Integer icnt;
  Integer hdl_a = g_a+GA_OFFSET;
  Integer hdl_b = s_b+GA_OFFSET;
  Integer hdl_c;
  int local_sync_begin,local_sync_end;
  Integer elemsize;
  Integer idim, jdim;
  Integer i, j, k, l, m, n, nn;
  Integer nprocs = pnga_pgroup_nnodes(SPA[hdl_b].grp);
  Integer me = pnga_pgroup_nodeid(SPA[hdl_b].grp);
  Integer longidx;
  Integer type;
  Integer ihi, ilo, jhi, jlo;
  Integer gdims[2], blocks[2];
  Integer rowdim;
  Integer *count;
  Integer nblocks;
  Integer g_c;
  Integer two = 2;
  Integer ilen;
  Integer max_nnz_a, max_nnz_b;
  Integer *row_nnz;
  int64_t max_nnz;
  Integer *map, *size;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(SPA[hdl_b].grp);

  /* Do some initial verification to see if matrix multiply is possible */
  if (GA[hdl_a].type != SPA[hdl_b].type) {
    pnga_error("(ga_sprs_array_dnssprs_multiply) types of sparse matrices"
    " A and B must match",0);
  }
  type = SPA[hdl_b].type;
  if (GA[hdl_a].p_handle != SPA[hdl_b].grp) {
    pnga_error("(ga_sprs_array_dnssprs_multiply) matrices A and B must"
    " be on the same group",0);
  }
  if (GA[hdl_a].ndim != 2) {
    pnga_error("(ga_sprs_array_dnssprs_multiply) matrix A must be"
    " of dimension 2",GA[hdl_a].ndim);
  }
  if ((trans && GA[hdl_a].dims[0] != SPA[hdl_b].jdim) ||
      (!trans && GA[hdl_a].dims[1] != SPA[hdl_b].jdim)) {
    pnga_error("(ga_sprs_array_dnssprs_multiply) column dimension of"
      " A must match row dimension of B",0);
  }
  if (SPA[hdl_b].idx_size == sizeof(int64_t)) {
    longidx = 1;
  } else {
    longidx = 0;
  }
  elemsize = SPA[hdl_b].size;
  if (trans) {
    idim = GA[hdl_a].dims[1];
  } else {
    idim = GA[hdl_a].dims[0];
  }
  jdim = SPA[hdl_b].jdim;
  /* Construct product array C*/
  g_c = pnga_create_handle();
  hdl_c = g_c + GA_OFFSET;
  if (trans) {
    gdims[0] = jdim;
    gdims[1] = idim;
  } else {
    gdims[0] = idim;
    gdims[1] = jdim;
  }
  pnga_set_data(g_c,two,gdims,type);
  map = (Integer*)malloc((nprocs+1)*sizeof(Integer));
  size = (Integer*)malloc(nprocs*sizeof(Integer));
  /* Create a partition for dense C matrix */
  ilo = (idim*me)/nprocs;
  while ((ilo*nprocs)/idim < me) {
    ilo++;
  }
  while ((ilo*nprocs)/idim > me) {
    ilo--;
  }
  if ((ilo*nprocs)/idim != me) {
    ilo++;
  }
  ilo++;
  if (me < nprocs-1) {
    ihi = (idim*(me+1))/nprocs;
    while ((ihi*nprocs)/idim < me+1) {
      ihi++;
    }
    while ((ihi*nprocs)/idim > me+1) {
      ihi--;
    }
    ihi--;
  } else {
    ihi = idim-1;
  }
  ihi++;

  for (i=0; i<nprocs; i++) size[i] = 0;
  size[me] = ihi-ilo+1;
  if (sizeof(Integer) == 8) {
    pnga_pgroup_gop(SPA[hdl_b].grp,C_LONG,size,nprocs,"+");
  } else {
    pnga_pgroup_gop(SPA[hdl_b].grp,C_INT,size,nprocs,"+");
  }
  if (trans) {
    map[0] = 1;
    map[1] = 1;
    for (i=1; i<nprocs; i++) {
      map[i+1] = map[i] + size[i-1];
    }
    blocks[0] = 1;
    blocks[1] = nprocs;
  } else {
    map[0] = 1;
    for (i=1; i<nprocs; i++) {
      map[i] = map[i-1] + size[i-1];
    }
    map[nprocs] = 1;
    blocks[0] = nprocs;
    blocks[1] = 1;
  }
  pnga_set_irreg_distr(g_c,map,blocks);
  pnga_set_pgroup(g_c,SPA[hdl_b].grp);
  if (!pnga_allocate(g_c)) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) could not allocate"
      " product array C",0);
  }
  pnga_zero(g_c);
  /* loop over processors in row to get target block and then loop over
   * processors to get all block pairs that contribute to target block.
   * Multiply block pairs */
  for (l=0; l<nprocs; l++) {
    /* Find bounding dimensions (unit-based) of target block in row */
    void *data_c;
    void *data_a, *data_b, *iptr, *jptr;
    Integer lo_c[2], hi_c[2], ld_c[2];
    Integer tlo_c[2], thi_c[2];
    lo_c[0] = ilo;
    hi_c[0] = ihi;
    pnga_sprs_array_row_distribution(s_b,l,&lo_c[1],&hi_c[1]);
    lo_c[1]++;
    hi_c[1]++;
    if (trans) {
      tlo_c[0] = lo_c[1];
      thi_c[0] = hi_c[1];
      tlo_c[1] = lo_c[0];
      thi_c[1] = hi_c[0];
    } else {
      tlo_c[0] = lo_c[0];
      thi_c[0] = hi_c[0];
      tlo_c[1] = lo_c[1];
      thi_c[1] = hi_c[1];
    }
    /* loop over all sub-blocks in row block of A and column block of B
     * that contribute to target block */
    for (n=0; n<nprocs; n++) {
      void *iptr_b, *jptr_b;
      Integer lo_a[2], hi_a[2], ld_a[2];
      Integer tlo_a[2], thi_a[2];
      Integer ilo_b, ihi_b, jlo_b, jhi_b;
      void *buf_a;
      void *val_b;
      Integer nelem;
      Integer ii,jlen;
      /* calculate values of jlo and jhi for block in g_b */
      if (trans) {
        ld_c[0] = jdim;
        ld_c[1] = thi_c[1]-tlo_c[1]+1;
      } else {
        ld_c[0] = thi_c[0]-tlo_c[0]+1;
        ld_c[1] = jdim;
      }
      pnga_access_ptr(g_c,tlo_c,thi_c,&data_c,ld_c);
      /* Get block of B for multiplication */
      if (!pnga_sprs_array_get_block(s_b,n,l,&iptr_b,&jptr_b,&val_b,
            &ilo_b,&ihi_b,&jlo_b,&jhi_b)) continue;
      /* get pointers to dense blocks on A and C */
      lo_a[0] = lo_c[0];
      hi_a[0] = hi_c[0];
      lo_a[1] = ilo_b;
      hi_a[1] = ihi_b;
      if (trans) {
        tlo_a[0] = lo_a[1];
        thi_a[0] = hi_a[1];
        tlo_a[1] = lo_a[0];
        thi_a[1] = hi_a[0];
      } else {
        tlo_a[0] = lo_a[0];
        thi_a[0] = hi_a[0];
        tlo_a[1] = lo_a[1];
        thi_a[1] = hi_a[1];
      }
      /* Copy block from dense array into buffer */
      nelem = (thi_a[0]-tlo_a[0]+1)*(thi_a[1]-tlo_a[1]+1);
      buf_a = malloc(nelem*SPA[hdl_b].size);
      ld_a[0] = (thi_a[0]-tlo_a[0]+1);
      ld_a[1] = (thi_a[1]-tlo_a[1]+1);
      pnga_get(g_a,tlo_a,thi_a,buf_a,ld_a);
      if (SPA[hdl_b].idx_size == 4) {
        int *idx_b = (int*)iptr_b;
        int *jdx_b = (int*)jptr_b;
        data_b = val_b;

        /* now have access to blocks from A, B, and C. Perform block
         * multiplication */
        if (type == C_INT) {
          REAL_DNSSPRS_MULTIPLY_M(int,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_LONG) {
          REAL_DNSSPRS_MULTIPLY_M(long,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_LONGLONG) {
          REAL_DNSSPRS_MULTIPLY_M(long long,tlo_a,thi_a,ilo_b,ihi_b,
              jlo_b,jhi_b,idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_FLOAT) {
          REAL_DNSSPRS_MULTIPLY_M(float,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_DBL) {
          REAL_DNSSPRS_MULTIPLY_M(double,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_SCPL) {
          COMPLEX_DNSSPRS_MULTIPLY_M(float,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,
              jhi_b,idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_DCPL) {
          COMPLEX_DNSSPRS_MULTIPLY_M(double,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,
              jhi_b,idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        }
      } else {
        int64_t *idx_b = (int64_t*)iptr_b;
        int64_t *jdx_b = (int64_t*)jptr_b;
        data_b = val_b;
        /* now have access to blocks from A, B, and C. Perform block
         * multiplication */
        if (type == C_INT) {
          REAL_DNSSPRS_MULTIPLY_M(int,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_LONG) {
          REAL_DNSSPRS_MULTIPLY_M(long,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_LONGLONG) {
          REAL_DNSSPRS_MULTIPLY_M(long long,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,
              jhi_b,idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_FLOAT) {
          REAL_DNSSPRS_MULTIPLY_M(float,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_DBL) {
          REAL_DNSSPRS_MULTIPLY_M(double,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_SCPL) {
          COMPLEX_DNSSPRS_MULTIPLY_M(float,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,
              jhi_b,idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_DCPL) {
          COMPLEX_DNSSPRS_MULTIPLY_M(double,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,
              jhi_b,idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        }
      }
      free(buf_a);
    }
  }
  if (local_sync_end) pnga_pgroup_sync(SPA[hdl_b].grp);
  return g_c;
}